

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O1

int arg(int argc,char **argv,int *i)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  Fl_Plugin *pFVar5;
  int index;
  int iVar6;
  Fl_Preferences *pFVar7;
  Fl_Plugin_Manager pm;
  Fl_Preferences FStack_48;
  
  pFVar7 = &FStack_48;
  iVar3 = *i;
  pcVar2 = argv[iVar3];
  cVar1 = pcVar2[1];
  if ((cVar1 == 'u') && (pcVar2[2] == '\0')) {
    update_file = update_file + 1;
    goto LAB_0019bf1a;
  }
  if (cVar1 == 'c') {
    if (pcVar2[2] == '\0') {
      compile_file = compile_file + 1;
LAB_0019bf1a:
      batch_mode = batch_mode + 1;
      *i = *i + 1;
      return 1;
    }
    if ((pcVar2[2] == 's') && (pcVar2[3] == '\0')) {
      compile_file = compile_file + 1;
      compile_strings = compile_strings + 1;
      goto LAB_0019bf1a;
    }
  }
  if (cVar1 == 'h') {
    if (pcVar2[2] == '\0') {
      header_file_name = argv[(long)iVar3 + 1];
      header_file_set = 1;
      goto LAB_0019bf40;
    }
  }
  else if (((cVar1 == 'o') && (pcVar2[2] == '\0')) && (iVar3 + 1 < argc)) {
    code_file_name = argv[(long)iVar3 + 1];
    code_file_set = 1;
LAB_0019bf40:
    *i = *i + 2;
    return 2;
  }
  Fl_Plugin_Manager::Fl_Plugin_Manager((Fl_Plugin_Manager *)&FStack_48,"commandline");
  iVar3 = Fl_Preferences::groups(&FStack_48);
  if (0 < iVar3) {
    index = 0;
    do {
      pFVar5 = Fl_Plugin_Manager::plugin((Fl_Plugin_Manager *)&FStack_48,index);
      uVar4 = (*pFVar5->_vptr_Fl_Plugin[5])(pFVar5,argc,argv,i);
      pFVar7 = (Fl_Preferences *)((ulong)pFVar7 & 0xffffffff);
      if (uVar4 != 0) {
        pFVar7 = (Fl_Preferences *)(ulong)uVar4;
      }
      iVar6 = (int)pFVar7;
      if (uVar4 != 0) goto LAB_0019bf0a;
      index = index + 1;
    } while (iVar3 != index);
  }
  iVar6 = 0;
LAB_0019bf0a:
  Fl_Plugin_Manager::~Fl_Plugin_Manager((Fl_Plugin_Manager *)&FStack_48);
  return iVar6;
}

Assistant:

static int arg(int argc, char** argv, int& i) {
  if (argv[i][1] == 'u' && !argv[i][2]) {update_file++; batch_mode++; i++; return 1;}
  if (argv[i][1] == 'c' && !argv[i][2]) {compile_file++; batch_mode++; i++; return 1;}
  if (argv[i][1] == 'c' && argv[i][2] == 's' && !argv[i][3]) {compile_file++; compile_strings++; batch_mode++; i++; return 1;}
  if (argv[i][1] == 'o' && !argv[i][2] && i+1 < argc) {
    code_file_name = argv[i+1];
    code_file_set  = 1;
    i += 2;
    return 2;
  }
  if (argv[i][1] == 'h' && !argv[i][2]) {
    header_file_name = argv[i+1];
    header_file_set  = 1;
    i += 2;
    return 2;
  }
  Fl_Plugin_Manager pm("commandline");
  int j, n = pm.plugins();
  for (j=0; j<n; j++) {
    Fl_Commandline_Plugin *pi = (Fl_Commandline_Plugin*)pm.plugin(j);
    int r = pi->arg(argc, argv, i);
    if (r) return r;
  }
  return 0;
}